

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawArc
          (cbtIDebugDraw *this,cbtVector3 *center,cbtVector3 *normal,cbtVector3 *axis,
          cbtScalar radiusA,cbtScalar radiusB,cbtScalar minAngle,cbtScalar maxAngle,
          cbtVector3 *color,bool drawSect,cbtScalar stepDegrees)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  undefined3 in_register_00000089;
  undefined1 auVar4 [16];
  float fVar5;
  undefined8 uVar8;
  undefined1 auVar6 [16];
  undefined8 uVar9;
  undefined1 auVar7 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [56];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  cbtVector3 cVar18;
  cbtScalar radiusA_local;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  cbtVector3 prev;
  float local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  cbtVector3 next;
  cbtVector3 local_40;
  undefined1 auVar17 [56];
  
  auVar13._4_60_ = in_register_00001244;
  auVar13._0_4_ = radiusB;
  auVar17 = in_register_00001244._4_56_;
  auVar10 = in_register_00001204._4_56_;
  local_c8 = CONCAT44(local_c8._4_4_,stepDegrees);
  local_d8 = CONCAT44(local_d8._4_4_,maxAngle);
  local_98 = auVar13._0_16_;
  radiusA_local = radiusA;
  cVar18 = cbtVector3::cross(normal,axis);
  auVar14._0_8_ = cVar18.m_floats._8_8_;
  auVar14._8_56_ = auVar17;
  auVar15._0_8_ = cVar18.m_floats._0_8_;
  auVar15._8_56_ = auVar10;
  _local_a8 = auVar15._0_16_;
  local_b8 = auVar14._0_16_;
  fVar1 = (float)local_d8 - minAngle;
  uVar9 = 0;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(ZEXT416((uint)(fVar1 / ((float)local_c8 * 0.017453292))),auVar4);
  uVar8 = auVar4._8_8_;
  uVar3 = (int)auVar4._0_4_ + (uint)((int)auVar4._0_4_ == 0);
  cVar18 = ::operator*(axis,&radiusA_local);
  local_d8 = cVar18.m_floats._8_8_;
  local_c8 = cVar18.m_floats._0_8_;
  uStack_d0 = uVar9;
  uStack_c0 = uVar8;
  fVar5 = cosf(minAngle);
  auVar11._0_4_ = fVar5 * (float)local_c8;
  auVar11._4_4_ = fVar5 * local_c8._4_4_;
  auVar11._8_4_ = fVar5 * (float)uStack_c0;
  auVar11._12_4_ = fVar5 * uStack_c0._4_4_;
  next.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar11,ZEXT416((uint)(fVar5 * (float)local_d8)),0x28);
  uVar8 = next.m_floats._8_8_;
  cVar18 = ::operator+(center,&next);
  local_c8._0_4_ = (float)local_98._0_4_ * (float)local_a8._0_4_;
  local_c8._4_4_ = (float)local_98._0_4_ * (float)local_a8._4_4_;
  uStack_c0._0_4_ = (float)local_98._0_4_ * (float)uStack_a0;
  uStack_c0._4_4_ = (float)local_98._0_4_ * uStack_a0._4_4_;
  local_d8 = CONCAT44(local_d8._4_4_,(float)local_98._0_4_ * (float)local_b8._0_4_);
  fVar5 = sinf(minAngle);
  local_78 = cVar18.m_floats[2];
  local_78 = fVar5 * (float)local_d8 + local_78;
  auVar15 = ZEXT464((uint)local_78);
  local_68 = cVar18.m_floats[0];
  fStack_64 = cVar18.m_floats[1];
  fStack_60 = (float)uVar8;
  fStack_5c = (float)((ulong)uVar8 >> 0x20);
  auVar6._0_4_ = fVar5 * (float)local_c8 + local_68;
  auVar6._4_4_ = fVar5 * local_c8._4_4_ + fStack_64;
  auVar6._8_4_ = fVar5 * (float)uStack_c0 + fStack_60;
  auVar6._12_4_ = fVar5 * uStack_c0._4_4_ + fStack_5c;
  prev.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,ZEXT416((uint)local_78),0x28);
  if (CONCAT31(in_register_00000089,drawSect) != 0) {
    (*this->_vptr_cbtIDebugDraw[4])(this,center,&prev,color);
  }
  for (iVar2 = 1; auVar10 = auVar15._8_56_, iVar2 - (~((int)uVar3 >> 0x1f) & uVar3) != 1;
      iVar2 = iVar2 + 1) {
    uVar8 = 0;
    local_98._0_4_ = ((float)iVar2 * fVar1) / (float)(int)uVar3 + minAngle;
    cVar18 = ::operator*(axis,&radiusA_local);
    auVar16._0_8_ = cVar18.m_floats._8_8_;
    auVar16._8_56_ = auVar10;
    uStack_a0 = uVar8;
    local_a8 = (undefined1  [8])cVar18.m_floats._0_8_;
    local_b8 = auVar16._0_16_;
    fVar5 = cosf((float)local_98._0_4_);
    auVar12._0_4_ = fVar5 * (float)local_a8._0_4_;
    auVar12._4_4_ = fVar5 * (float)local_a8._4_4_;
    auVar12._8_4_ = fVar5 * (float)uStack_a0;
    auVar12._12_4_ = fVar5 * uStack_a0._4_4_;
    uVar8 = auVar12._8_8_;
    local_40.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar12,ZEXT416((uint)(fVar5 * (float)local_b8._0_4_)),0x28);
    uVar9 = local_40.m_floats._8_8_;
    cVar18 = ::operator+(center,&local_40);
    uStack_a0 = uVar9;
    local_a8 = (undefined1  [8])cVar18.m_floats._0_8_;
    local_b8._8_8_ = uVar8;
    local_b8._0_8_ = cVar18.m_floats._8_8_;
    fVar5 = sinf((float)local_98._0_4_);
    auVar7._0_4_ = fVar5 * (float)local_c8 + (float)local_a8._0_4_;
    auVar7._4_4_ = fVar5 * local_c8._4_4_ + (float)local_a8._4_4_;
    auVar7._8_4_ = fVar5 * (float)uStack_c0 + (float)uStack_a0;
    auVar7._12_4_ = fVar5 * uStack_c0._4_4_ + uStack_a0._4_4_;
    fVar5 = fVar5 * (float)local_d8 + (float)local_b8._0_4_;
    auVar15 = ZEXT464((uint)fVar5);
    next.m_floats = (cbtScalar  [4])vinsertps_avx(auVar7,ZEXT416((uint)fVar5),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,&prev,&next,color);
    prev.m_floats[0] = next.m_floats[0];
    prev.m_floats[1] = next.m_floats[1];
    prev.m_floats[2] = next.m_floats[2];
    prev.m_floats[3] = next.m_floats[3];
  }
  if (drawSect) {
    (*this->_vptr_cbtIDebugDraw[4])(this,center,&prev,color);
  }
  return;
}

Assistant:

virtual void drawArc(const cbtVector3& center, const cbtVector3& normal, const cbtVector3& axis, cbtScalar radiusA, cbtScalar radiusB, cbtScalar minAngle, cbtScalar maxAngle,
						 const cbtVector3& color, bool drawSect, cbtScalar stepDegrees = cbtScalar(10.f))
	{
		const cbtVector3& vx = axis;
		cbtVector3 vy = normal.cross(axis);
		cbtScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		int nSteps = (int)cbtFabs((maxAngle - minAngle) / step);
		if (!nSteps) nSteps = 1;
		cbtVector3 prev = center + radiusA * vx * cbtCos(minAngle) + radiusB * vy * cbtSin(minAngle);
		if (drawSect)
		{
			drawLine(center, prev, color);
		}
		for (int i = 1; i <= nSteps; i++)
		{
			cbtScalar angle = minAngle + (maxAngle - minAngle) * cbtScalar(i) / cbtScalar(nSteps);
			cbtVector3 next = center + radiusA * vx * cbtCos(angle) + radiusB * vy * cbtSin(angle);
			drawLine(prev, next, color);
			prev = next;
		}
		if (drawSect)
		{
			drawLine(center, prev, color);
		}
	}